

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O1

void shared_cleanup(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *__format;
  long lVar4;
  flock_t flk;
  shmid_ds ds;
  shmid_ds local_98;
  
  if (shared_debug != 0) {
    printf("shared_cleanup:");
  }
  if (shared_lt != (SHARED_LTAB *)0x0) {
    if (shared_debug != 0) {
      printf(" deleting segments:");
    }
    if (0 < shared_maxseg) {
      lVar4 = 0xc;
      uVar3 = 0;
      do {
        if (((*(int *)((long)shared_lt + lVar4 + -4) != 0) &&
            (*(int *)((long)&shared_lt->p + lVar4) == -1)) &&
           (iVar1 = shared_destroy_entry((int)uVar3), shared_debug != 0)) {
          __format = " [%d]";
          if (iVar1 != 0) {
            __format = " [error on %d !!!!]";
          }
          printf(__format,uVar3 & 0xffffffff);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while ((long)uVar3 < (long)shared_maxseg);
    }
    free(shared_lt);
    shared_lt = (SHARED_LTAB *)0x0;
  }
  if (shared_gt != (SHARED_GTAB *)0x0) {
    if (shared_debug != 0) {
      printf(" detaching globalsharedtable");
    }
    iVar1 = fcntl(shared_fd,6);
    if (iVar1 == -1) {
LAB_00139b95:
      shmdt(shared_gt);
    }
    else {
      if (0 < (long)shared_maxseg) {
        lVar4 = 0;
        do {
          if (*(int *)((long)&shared_gt->key + lVar4) != -1) goto LAB_00139b95;
          lVar4 = lVar4 + 0x1c;
        } while ((long)shared_maxseg * 0x1c != lVar4);
      }
      iVar2 = shmctl(shared_gt_h,2,&local_98);
      shmdt(shared_gt);
      if ((iVar2 == 0) && (local_98.shm_nattch < 2)) {
        shmctl(shared_gt_h,0,(shmid_ds *)0x0);
        shared_gt_h = -1;
      }
    }
    shared_gt = (SHARED_GTAB *)0x0;
    if (iVar1 != -1) {
      fcntl(shared_fd,6);
    }
  }
  shared_gt_h = -1;
  if (shared_fd != -1) {
    if (shared_debug != 0) {
      printf(" closing lockfile");
    }
    close(shared_fd);
    shared_fd = -1;
  }
  shared_kbase = 0;
  shared_maxseg = 0;
  shared_range = 0;
  shared_init_called = 0;
  if (shared_debug != 0) {
    puts(" <<done>>");
  }
  return;
}

Assistant:

void    shared_cleanup(void)                    /* this must (should) be called during exit/abort */
 { int          i, j, r, oktodelete, filelocked, segmentspresent;
   flock_t      flk;
   struct shmid_ds  ds;

   if (shared_debug) printf("shared_cleanup:");
   if (NULL != shared_lt)
     { if (shared_debug) printf(" deleting segments:");
       for (i=0; i<shared_maxseg; i++)
        { if (0 == shared_lt[i].tcnt) continue; /* we're not using this segment, skip this ... */
          if (-1 != shared_lt[i].lkcnt) continue;  /* seg not R/W locked by us, skip this ... */

          r = shared_destroy_entry(i);          /* destroy unconditionally sema & segment */
          if (shared_debug) 
            { if (SHARED_OK == r) printf(" [%d]", i);
              else printf(" [error on %d !!!!]", i);

            }
        }
       free((void *)shared_lt);                 /* free local table */
       shared_lt = NULL;
     }
   if (NULL != shared_gt)                       /* detach global index table */
     { oktodelete = 0;
       filelocked = 0;
       if (shared_debug) printf(" detaching globalsharedtable");
       if (SHARED_INVALID != shared_fd)

       flk.l_type = F_WRLCK;                    /* lock whole lock file */
       flk.l_whence = 0;
       flk.l_start = 0;
       flk.l_len = shared_maxseg;
       if (-1 != fcntl(shared_fd, F_SETLK, &flk))
         { filelocked = 1;                      /* success, scan global table, to see if there are any segs */
           segmentspresent = 0;                 /* assume, there are no segs in the system */
           for (j=0; j<shared_maxseg; j++)
            { if (SHARED_INVALID != shared_gt[j].key)
                { segmentspresent = 1;          /* yes, there is at least one */
                  break;
                }
            }
           if (0 == segmentspresent)            /* if there are no segs ... */
             if (0 == shmctl(shared_gt_h, IPC_STAT, &ds)) /* get number of processes attached to table */
               { if (ds.shm_nattch <= 1) oktodelete = 1; /* if only one (we), then it is safe (but see text 4 lines later) to unlink */
               }
         }
       shmdt((char *)shared_gt);                /* detach global table */
       if (oktodelete)                          /* delete global table from system, if no shm seg present */
         { shmctl(shared_gt_h, IPC_RMID, 0);    /* there is a race condition here - time window between shmdt and shmctl */
           shared_gt_h = SHARED_INVALID;
         }
       shared_gt = NULL;
       if (filelocked)                          /* if we locked, we need to unlock */
         { flk.l_type = F_UNLCK;
           flk.l_whence = 0;
           flk.l_start = 0;
           flk.l_len = shared_maxseg;
           fcntl(shared_fd, F_SETLK, &flk);
         }
     }
   shared_gt_h = SHARED_INVALID;

   if (SHARED_INVALID != shared_fd)             /* close lock file */
     { if (shared_debug) printf(" closing lockfile");
       close(shared_fd);
       shared_fd = SHARED_INVALID;
     }

   
   shared_kbase = 0;
   shared_maxseg = 0;
   shared_range = 0;
   shared_init_called = 0;

   if (shared_debug) printf(" <<done>>\n");
   return;
 }